

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remaining_time_counter.hpp
# Opt level: O0

void __thiscall so_5::details::remaining_time_counter_t::update(remaining_time_counter_t *this)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> dVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  type elapsed;
  time_point now;
  remaining_time_counter_t *this_local;
  
  elapsed.__r = std::chrono::_V2::steady_clock::now();
  local_20.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&elapsed,&this->m_last_time);
  (this->m_last_time).__d.__r = elapsed.__r;
  bVar1 = std::chrono::operator<(&local_20,&this->m_remaining);
  if (bVar1) {
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-=
              (&this->m_remaining,&local_20);
  }
  else {
    dVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::zero();
    (this->m_remaining).__r = dVar2.__r;
  }
  return;
}

Assistant:

void
		update()
			{
				const auto now = std::chrono::steady_clock::now();
				const auto elapsed = now - m_last_time;
				m_last_time = now;

				if( elapsed < m_remaining )
					m_remaining -= elapsed;
				else
					m_remaining = duration::zero();
			}